

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

Vec4 __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::getSamplePos
          (ImageSampleInstanceImages *this,VkImageViewType viewType,deUint32 baseMipLevel,
          deUint32 baseArraySlice,int samplePosNdx)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  undefined4 in_XMM0_Db;
  float fVar6;
  ulong in_XMM1_Qa;
  float fVar7;
  float fVar8;
  Vec4 VVar9;
  deUint32 slices [4];
  Vec3 coords [4];
  
  uVar3 = 0x40 >> ((byte)baseMipLevel & 0x1f);
  uVar1 = 1;
  if ((viewType & ~VK_IMAGE_VIEW_TYPE_2D) == VK_IMAGE_VIEW_TYPE_1D_ARRAY) {
    uVar1 = 2 - baseArraySlice;
  }
  if (viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) {
    uVar1 = 2 - baseArraySlice;
  }
  uVar2 = (ulong)uVar1;
  if (viewType < VK_IMAGE_VIEW_TYPE_LAST) {
    if ((0x37U >> (viewType & 0x1f) & 1) == 0) {
      coords[0].m_data[2] = (float)(int)uVar3;
      coords[0].m_data[0] = 0.75;
      coords[0].m_data[1] = 0.5;
      coords[1].m_data[0] = (float)(uVar3 + 0xf & 0xd) + 0.25;
      uVar4 = uVar3 + 0x7f;
      coords[1].m_data[1] = 0.0;
      coords[1].m_data[2] = (float)(uVar3 - 1 & 0x10) + 0.5;
      coords[2].m_data[0] = 0.0;
      coords[2].m_data[1] = (float)(uVar4 & 0x54) + 0.5;
      coords[2].m_data[2] = (float)(uVar3 + 0xf & 10) + 0.75;
      coords[3].m_data[0] = coords[0].m_data[2];
      coords[3].m_data[1] = (float)(uVar4 & 0x4b) + 0.25;
      coords[3].m_data[2] = (float)(uVar4 & 0x53) + 0.75;
      slices[0] = (uint)(uVar1 != 1);
      slices[1] = (deUint32)(2 % (ulong)uVar1);
      slices[2] = (deUint32)(9 % uVar2);
      slices[3] = (deUint32)(5 % (ulong)uVar1);
      fVar5 = coords[samplePosNdx].m_data[0] / coords[0].m_data[2];
      fVar6 = fVar5 + fVar5 + -1.0;
      in_XMM1_Qa = (ulong)(uint)fVar6;
      fVar7 = coords[samplePosNdx].m_data[1] / coords[0].m_data[2];
      fVar8 = coords[samplePosNdx].m_data[2] / coords[0].m_data[2];
      fVar5 = (float)slices[samplePosNdx];
      (this->super_ImageInstanceImages).m_viewType = (VkImageViewType)fVar6;
      (this->super_ImageInstanceImages).m_baseMipLevel = (deUint32)(fVar7 + fVar7 + -1.0);
      (this->super_ImageInstanceImages).m_baseArraySlice = (deUint32)(fVar8 + fVar8 + -1.0);
      (this->super_ImageInstanceImages).m_imageFormat.order = (ChannelOrder)fVar5;
      goto LAB_00548e97;
    }
    coords[0].m_data[0] = 0.75;
    coords[0].m_data[1] = 0.5;
    coords[0].m_data[2] = (float)(uVar3 - 1 & 0xc) + 0.25;
    uVar1 = uVar3 + 0x7f;
    in_XMM0_Db = 0;
    fVar5 = (float)(int)uVar3;
    coords[1].m_data[0] = (float)(uVar3 + 0x1f & 0x17) + 0.25;
    coords[1].m_data[1] = (float)(uVar1 & 0x49) + 0.5;
    coords[1].m_data[2] = (float)(uVar3 + 0x1f & 0x10) + 0.5 + fVar5;
    coords[2].m_data[0] = 0.25 - (float)(uVar3 - 1 & 0x2b);
    coords[2].m_data[2] = (float)(uVar1 & 0x75) + 0.75;
    in_XMM1_Qa = (ulong)(uint)coords[2].m_data[2];
    coords[2].m_data[1] = (float)(uVar1 & 0x54) + 0.5 + fVar5;
    coords[3].m_data[0] = fVar5 + 0.5;
    coords[3].m_data[1] = (float)(uVar1 & 0x4b) + 0.25;
    coords[3].m_data[2] = (float)(uVar1 & 0x53) + 0.25 + fVar5;
    slices[0] = 0;
    slices[1] = (deUint32)(4 % uVar2);
    slices[2] = (deUint32)(9 % uVar2);
    slices[3] = (deUint32)(2 % uVar2);
    if ((viewType & ~VK_IMAGE_VIEW_TYPE_1D_ARRAY) == VK_IMAGE_VIEW_TYPE_2D) {
      fVar6 = coords[samplePosNdx].m_data[0] / fVar5;
      fVar7 = coords[samplePosNdx].m_data[1] / fVar5;
      fVar5 = (float)slices[samplePosNdx];
      (this->super_ImageInstanceImages).m_viewType = (VkImageViewType)fVar6;
      (this->super_ImageInstanceImages).m_baseMipLevel = (deUint32)fVar7;
      (this->super_ImageInstanceImages).m_baseArraySlice = (deUint32)fVar5;
    }
    else {
      if ((viewType & ~VK_IMAGE_VIEW_TYPE_1D_ARRAY) == VK_IMAGE_VIEW_TYPE_1D) {
        uVar1 = slices[samplePosNdx];
        fVar6 = coords[samplePosNdx].m_data[0] / fVar5;
        in_XMM1_Qa = (ulong)(uint)fVar6;
        (this->super_ImageInstanceImages).m_viewType = (VkImageViewType)fVar6;
        (this->super_ImageInstanceImages).m_baseMipLevel = (deUint32)(float)uVar1;
        (this->super_ImageInstanceImages).m_baseArraySlice = 0;
        (this->super_ImageInstanceImages).m_imageFormat.order = R;
        goto LAB_00548e97;
      }
      if (viewType != VK_IMAGE_VIEW_TYPE_3D) goto LAB_00548e91;
      fVar7 = coords[samplePosNdx].m_data[1];
      fVar6 = coords[samplePosNdx].m_data[0] / fVar5;
      fVar8 = coords[samplePosNdx].m_data[2];
      (this->super_ImageInstanceImages).m_viewType = (VkImageViewType)fVar6;
      (this->super_ImageInstanceImages).m_baseMipLevel = (deUint32)(fVar7 / fVar5);
      (this->super_ImageInstanceImages).m_baseArraySlice = (deUint32)(fVar8 / fVar5);
    }
    in_XMM1_Qa = (ulong)(uint)fVar6;
    in_XMM0_Db = 0;
    (this->super_ImageInstanceImages).m_imageFormat.order = R;
  }
  else {
LAB_00548e91:
    fVar5 = 0.0;
    in_XMM0_Db = 0;
    (this->super_ImageInstanceImages).m_viewType = VK_IMAGE_VIEW_TYPE_1D;
    (this->super_ImageInstanceImages).m_baseMipLevel = 0;
    (this->super_ImageInstanceImages).m_baseArraySlice = 0;
    (this->super_ImageInstanceImages).m_imageFormat.order = R;
  }
LAB_00548e97:
  VVar9.m_data[1] = (float)in_XMM0_Db;
  VVar9.m_data[0] = fVar5;
  VVar9.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar9.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  return (Vec4)VVar9.m_data;
}

Assistant:

tcu::Vec4 ImageSampleInstanceImages::getSamplePos (vk::VkImageViewType viewType, deUint32 baseMipLevel, deUint32 baseArraySlice, int samplePosNdx)
{
	DE_ASSERT(de::inBounds(samplePosNdx, 0, 4));

	const deUint32	imageSize	= (deUint32)IMAGE_SIZE >> baseMipLevel;
	const deUint32	arraySize	= isImageViewTypeArray(viewType) ? ARRAY_SIZE - baseArraySlice : 1;

	// choose arbitrary values that are not ambiguous with NEAREST filtering

	switch (viewType)
	{
		case vk::VK_IMAGE_VIEW_TYPE_1D:
		case vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		case vk::VK_IMAGE_VIEW_TYPE_2D:
		case vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case vk::VK_IMAGE_VIEW_TYPE_3D:
		{
			const tcu::Vec3	coords[4]	=
			{
				tcu::Vec3(0.75f,
						  0.5f,
						  (float)(12u % imageSize) + 0.25f),

				tcu::Vec3((float)(23u % imageSize) + 0.25f,
						  (float)(73u % imageSize) + 0.5f,
						  (float)(16u % imageSize) + 0.5f + (float)imageSize),

				tcu::Vec3(-(float)(43u % imageSize) + 0.25f,
						  (float)(84u % imageSize) + 0.5f + (float)imageSize,
						  (float)(117u % imageSize) + 0.75f),

				tcu::Vec3((float)imageSize + 0.5f,
						  (float)(75u % imageSize) + 0.25f,
						  (float)(83u % imageSize) + 0.25f + (float)imageSize),
			};
			const deUint32	slices[4]	=
			{
				0u % arraySize,
				4u % arraySize,
				9u % arraySize,
				2u % arraySize,
			};

			if (viewType == vk::VK_IMAGE_VIEW_TYPE_1D || viewType == vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY)
				return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize,
								 (float)slices[samplePosNdx],
								 0.0f,
								 0.0f);
			else if (viewType == vk::VK_IMAGE_VIEW_TYPE_2D || viewType == vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY)
				return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize,
								 coords[samplePosNdx].y() / (float)imageSize,
								 (float)slices[samplePosNdx],
								 0.0f);
			else if (viewType == vk::VK_IMAGE_VIEW_TYPE_3D)
				return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize,
								 coords[samplePosNdx].y() / (float)imageSize,
								 coords[samplePosNdx].z() / (float)imageSize,
								 0.0f);
			else
			{
				DE_FATAL("Impossible");
				return tcu::Vec4();
			}
		}

		case vk::VK_IMAGE_VIEW_TYPE_CUBE:
		case vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
		{
			// \note these values are in [0, texSize]*3 space for convenience
			const tcu::Vec3	coords[4]	=
			{
				tcu::Vec3(0.75f,
						  0.5f,
						  (float)imageSize),

				tcu::Vec3((float)(13u % imageSize) + 0.25f,
						  0.0f,
						  (float)(16u % imageSize) + 0.5f),

				tcu::Vec3(0.0f,
						  (float)(84u % imageSize) + 0.5f,
						  (float)(10u % imageSize) + 0.75f),

				tcu::Vec3((float)imageSize,
						  (float)(75u % imageSize) + 0.25f,
						  (float)(83u % imageSize) + 0.75f),
			};
			const deUint32	slices[4]	=
			{
				1u % arraySize,
				2u % arraySize,
				9u % arraySize,
				5u % arraySize,
			};

			DE_ASSERT(de::inRange(coords[samplePosNdx].x(), 0.0f, (float)imageSize));
			DE_ASSERT(de::inRange(coords[samplePosNdx].y(), 0.0f, (float)imageSize));
			DE_ASSERT(de::inRange(coords[samplePosNdx].z(), 0.0f, (float)imageSize));

			// map to [-1, 1]*3 space
			return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize * 2.0f - 1.0f,
							 coords[samplePosNdx].y() / (float)imageSize * 2.0f - 1.0f,
							 coords[samplePosNdx].z() / (float)imageSize * 2.0f - 1.0f,
							 (float)slices[samplePosNdx]);
		}

		default:
			DE_FATAL("Impossible");
			return tcu::Vec4();
	}
}